

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O0

REF_STATUS
ref_cavity_form_edge_swap
          (REF_CAVITY ref_cavity,REF_GRID ref_grid,REF_INT node0,REF_INT node1,REF_INT node)

{
  uint uVar1;
  long lVar2;
  bool bVar3;
  bool bVar4;
  REF_INT local_f4;
  REF_INT local_f0;
  int local_ec;
  REF_INT local_e8;
  REF_INT local_e0;
  int local_dc;
  REF_STATUS ref_private_macro_code_rss_13;
  REF_STATUS ref_private_macro_code_rsb;
  REF_STATUS ref_private_macro_code_rss_12;
  REF_STATUS ref_private_macro_code_rss_11;
  REF_STATUS ref_private_macro_code_rss_10;
  REF_STATUS ref_private_macro_code_rss_9;
  REF_LONG ref_private_status_reis_bi;
  REF_LONG ref_private_status_reis_ai;
  REF_STATUS ref_private_macro_code_rss_8;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_INT seg_nodes [3];
  REF_INT face_nodes [3];
  REF_BOOL all_local;
  REF_BOOL already_have_it;
  REF_BOOL has_node1;
  REF_BOOL has_node0;
  REF_BOOL has_triangle;
  REF_INT cell_face;
  REF_INT face_node;
  REF_INT node3;
  REF_INT node2;
  REF_INT cell;
  REF_INT cell_node;
  REF_INT item;
  REF_CELL ref_cell;
  REF_NODE ref_node;
  int local_28;
  REF_INT node_local;
  REF_INT node1_local;
  REF_INT node0_local;
  REF_GRID ref_grid_local;
  REF_CAVITY ref_cavity_local;
  
  ref_cell = (REF_CELL)ref_grid->node;
  ref_node._4_4_ = node;
  local_28 = node1;
  node_local = node0;
  _node1_local = ref_grid;
  ref_grid_local = (REF_GRID)ref_cavity;
  uVar1 = ref_cavity_form_empty(ref_cavity,ref_grid,node);
  if (uVar1 == 0) {
    if (((*(int *)(*(long *)&ref_cell[1].size_per + 4) ==
          *(int *)(*(long *)&ref_cell->n + (long)node_local * 4)) &&
        (*(int *)(*(long *)&ref_cell[1].size_per + 4) ==
         *(int *)(*(long *)&ref_cell->n + (long)local_28 * 4))) &&
       (*(int *)(*(long *)&ref_cell[1].size_per + 4) ==
        *(int *)(*(long *)&ref_cell->n + (long)ref_node._4_4_ * 4))) {
      if ((_node1_local->cell[9]->n < 1) && (_node1_local->cell[10]->n < 1)) {
        _cell_node = _node1_local->cell[8];
        if ((node_local < 0) || (_cell_node->ref_adj->nnode <= node_local)) {
          local_dc = -1;
        }
        else {
          local_dc = _cell_node->ref_adj->first[node_local];
        }
        cell = local_dc;
        if (local_dc == -1) {
          local_e0 = -1;
        }
        else {
          local_e0 = _cell_node->ref_adj->item[local_dc].ref;
        }
        node3 = local_e0;
        while (cell != -1) {
          for (node2 = 0; node2 < _cell_node->node_per; node2 = node2 + 1) {
            if (local_28 == _cell_node->c2n[node2 + _cell_node->size_per * node3]) {
              uVar1 = ref_list_contains((REF_LIST)ref_grid_local->cell[8],node3,face_nodes + 2);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x522,"ref_cavity_form_edge_swap",(ulong)uVar1,"have tet?");
                return uVar1;
              }
              if (face_nodes[2] != 0) {
                printf("%s: %d: %s: %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x523,"ref_cavity_form_edge_swap","added tet twice?");
                return 1;
              }
              uVar1 = ref_list_push((REF_LIST)ref_grid_local->cell[8],node3);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x524,"ref_cavity_form_edge_swap",(ulong)uVar1,"save tet");
                return uVar1;
              }
              uVar1 = ref_cell_all_local(_cell_node,(REF_NODE)ref_cell,node3,face_nodes + 1);
              if (uVar1 != 0) {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                       ,0x525,"ref_cavity_form_edge_swap",(ulong)uVar1,"local cell");
                return uVar1;
              }
              if (face_nodes[1] == 0) {
                *(undefined4 *)&ref_grid_local->mpi = 3;
                return 0;
              }
              for (has_node0 = 0; has_node0 < _cell_node->face_per; has_node0 = has_node0 + 1) {
                for (has_triangle = 0; has_triangle < 3; has_triangle = has_triangle + 1) {
                  seg_nodes[(long)has_triangle + 1] =
                       _cell_node->c2n
                       [_cell_node->f2n[has_triangle + has_node0 * 4] + _cell_node->size_per * node3
                       ];
                }
                bVar3 = true;
                if ((node_local != seg_nodes[1]) && (bVar3 = true, node_local != seg_nodes[2])) {
                  bVar3 = node_local == face_nodes[0];
                }
                bVar4 = true;
                if ((local_28 != seg_nodes[1]) && (bVar4 = true, local_28 != seg_nodes[2])) {
                  bVar4 = local_28 == face_nodes[0];
                }
                if (((!bVar3) || (!bVar4)) &&
                   (uVar1 = ref_cavity_insert_face((REF_CAVITY)ref_grid_local,seg_nodes + 1),
                   uVar1 != 0)) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                         ,0x534,"ref_cavity_form_edge_swap",(ulong)uVar1,"tet side");
                  return uVar1;
                }
              }
            }
          }
          cell = _cell_node->ref_adj->item[cell].next;
          if (cell == -1) {
            local_e8 = -1;
          }
          else {
            local_e8 = _cell_node->ref_adj->item[cell].ref;
          }
          node3 = local_e8;
        }
        _cell_node = _node1_local->cell[3];
        uVar1 = ref_cell_has_side(_cell_node,node_local,local_28,&has_node1);
        if (uVar1 == 0) {
          if (has_node1 != 0) {
            uVar1 = ref_swap_node23(_node1_local,node_local,local_28,&face_node,&cell_face);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x53e,"ref_cavity_form_edge_swap",(ulong)uVar1,"nodes 2 and 3");
              return uVar1;
            }
            *(REF_INT *)((long)ref_grid_local->cell + 4) = face_node;
            seg_nodes[0] = -1;
            if ((node_local < 0) || (_cell_node->ref_adj->nnode <= node_local)) {
              local_ec = -1;
            }
            else {
              local_ec = _cell_node->ref_adj->first[node_local];
            }
            cell = local_ec;
            if (local_ec == -1) {
              local_f0 = -1;
            }
            else {
              local_f0 = _cell_node->ref_adj->item[local_ec].ref;
            }
            node3 = local_f0;
            while (cell != -1) {
              for (node2 = 0; node2 < _cell_node->node_per; node2 = node2 + 1) {
                if (local_28 == _cell_node->c2n[node2 + _cell_node->size_per * node3]) {
                  uVar1 = ref_list_push((REF_LIST)ref_grid_local->cell[7],node3);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0x544,"ref_cavity_form_edge_swap",(ulong)uVar1,"save tri");
                    return uVar1;
                  }
                  uVar1 = ref_cell_all_local(_cell_node,(REF_NODE)ref_cell,node3,face_nodes + 1);
                  if (uVar1 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                           ,0x546,"ref_cavity_form_edge_swap",(ulong)uVar1,"local cell");
                    return uVar1;
                  }
                  if (face_nodes[1] == 0) {
                    *(undefined4 *)&ref_grid_local->mpi = 3;
                    return 0;
                  }
                  seg_nodes[0] = _cell_node->c2n
                                 [_cell_node->node_per + _cell_node->size_per * node3];
                }
              }
              cell = _cell_node->ref_adj->item[cell].next;
              if (cell == -1) {
                local_f4 = -1;
              }
              else {
                local_f4 = _cell_node->ref_adj->item[cell].ref;
              }
              node3 = local_f4;
            }
            lVar2 = (long)(int)ref_grid_local->cell[7]->type;
            if (lVar2 != 2) {
              printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x54d,"ref_cavity_form_edge_swap","expect two tri",2,lVar2);
              return 1;
            }
            if (seg_nodes[0] == -1) {
              printf("%s: %d: %s: %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x54e,"ref_cavity_form_edge_swap","faceid not set");
              return 1;
            }
            ref_private_macro_code_rss_1 = node_local;
            ref_private_macro_code_rss = cell_face;
            uVar1 = ref_cavity_insert_seg((REF_CAVITY)ref_grid_local,&ref_private_macro_code_rss_1);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x551,"ref_cavity_form_edge_swap",(ulong)uVar1,"tri side");
              return uVar1;
            }
            ref_private_macro_code_rss_1 = cell_face;
            ref_private_macro_code_rss = local_28;
            uVar1 = ref_cavity_insert_seg((REF_CAVITY)ref_grid_local,&ref_private_macro_code_rss_1);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x554,"ref_cavity_form_edge_swap",(ulong)uVar1,"tri side");
              return uVar1;
            }
            ref_private_macro_code_rss_1 = local_28;
            ref_private_macro_code_rss = face_node;
            uVar1 = ref_cavity_insert_seg((REF_CAVITY)ref_grid_local,&ref_private_macro_code_rss_1);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x557,"ref_cavity_form_edge_swap",(ulong)uVar1,"tri side");
              return uVar1;
            }
            ref_private_macro_code_rss_1 = face_node;
            ref_private_macro_code_rss = node_local;
            uVar1 = ref_cavity_insert_seg((REF_CAVITY)ref_grid_local,&ref_private_macro_code_rss_1);
            if (uVar1 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x55a,"ref_cavity_form_edge_swap",(ulong)uVar1,"tri side");
              return uVar1;
            }
          }
          uVar1 = ref_cavity_verify_face_manifold((REF_CAVITY)ref_grid_local);
          if (uVar1 == 0) {
            ref_cavity_local._4_4_ = ref_cavity_verify_seg_manifold((REF_CAVITY)ref_grid_local);
            if (ref_cavity_local._4_4_ == 0) {
              ref_cavity_local._4_4_ = 0;
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                     ,0x563,"ref_cavity_form_edge_swap",(ulong)ref_cavity_local._4_4_,
                     "swap seg manifold");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c"
                   ,0x562,"ref_cavity_form_edge_swap",(ulong)uVar1,"swap face manifold");
            printf(" %f %f %f\n",
                   *(undefined8 *)(ref_cell->c2n + (long)(*(int *)ref_grid_local->cell * 0xf) * 2),
                   *(undefined8 *)
                    (ref_cell->c2n + (long)(*(int *)ref_grid_local->cell * 0xf + 1) * 2),
                   *(undefined8 *)
                    (ref_cell->c2n + (long)(*(int *)ref_grid_local->cell * 0xf + 2) * 2));
            ref_cavity_local._4_4_ = uVar1;
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x53b,"ref_cavity_form_edge_swap",(ulong)uVar1,"triangle side");
          ref_cavity_local._4_4_ = uVar1;
        }
      }
      else {
        *(undefined4 *)&ref_grid_local->mpi = 4;
        ref_cavity_local._4_4_ = 0;
      }
    }
    else {
      *(undefined4 *)&ref_grid_local->mpi = 3;
      ref_cavity_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",0x50f,
           "ref_cavity_form_edge_swap",(ulong)uVar1,"init form empty");
    ref_cavity_local._4_4_ = uVar1;
  }
  return ref_cavity_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_cavity_form_edge_swap(REF_CAVITY ref_cavity,
                                             REF_GRID ref_grid, REF_INT node0,
                                             REF_INT node1, REF_INT node) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_CELL ref_cell;
  REF_INT item, cell_node, cell;
  REF_INT node2, node3, face_node, cell_face;
  REF_BOOL has_triangle, has_node0, has_node1;
  REF_BOOL already_have_it, all_local;
  REF_INT face_nodes[3], seg_nodes[3];
  RSS(ref_cavity_form_empty(ref_cavity, ref_grid, node), "init form empty");

  if (!ref_node_owned(ref_node, node0) || !ref_node_owned(ref_node, node1) ||
      !ref_node_owned(ref_node, node)) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
    return REF_SUCCESS;
  }

  /* mixed element protections are not mature */
  if (ref_cell_n(ref_grid_pyr(ref_grid)) > 0 ||
      ref_cell_n(ref_grid_pri(ref_grid)) > 0) {
    ref_cavity_state(ref_cavity) = REF_CAVITY_MANIFOLD_CONSTRAINED;
    return REF_SUCCESS;
  }

  ref_cell = ref_grid_tet(ref_grid);
  each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
    RSS(ref_list_contains(ref_cavity_tet_list(ref_cavity), cell,
                          &already_have_it),
        "have tet?");
    RAS(!already_have_it, "added tet twice?");
    RSS(ref_list_push(ref_cavity_tet_list(ref_cavity), cell), "save tet");
    RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local), "local cell");
    if (!all_local) {
      ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
      return REF_SUCCESS;
    }
    each_ref_cell_cell_face(ref_cell, cell_face) {
      each_ref_cavity_face_node(ref_cavity, face_node) {
        face_nodes[face_node] =
            ref_cell_f2n(ref_cell, face_node, cell_face, cell);
      }
      has_node0 = (node0 == face_nodes[0] || node0 == face_nodes[1] ||
                   node0 == face_nodes[2]);
      has_node1 = (node1 == face_nodes[0] || node1 == face_nodes[1] ||
                   node1 == face_nodes[2]);
      if (!(has_node0 && has_node1)) {
        RSS(ref_cavity_insert_face(ref_cavity, face_nodes), "tet side");
      }
    }
  }

  ref_cell = ref_grid_tri(ref_grid);
  RSS(ref_cell_has_side(ref_cell, node0, node1, &has_triangle),
      "triangle side");
  if (has_triangle) {
    RSS(ref_swap_node23(ref_grid, node0, node1, &node2, &node3),
        "nodes 2 and 3");

    ref_cavity_surf_node(ref_cavity) = node2;

    seg_nodes[2] = REF_EMPTY;
    each_ref_cell_having_node2(ref_cell, node0, node1, item, cell_node, cell) {
      RSS(ref_list_push(ref_cavity_tri_list(ref_cavity), cell), "save tri");
      RSS(ref_cell_all_local(ref_cell, ref_node, cell, &all_local),
          "local cell");
      if (!all_local) {
        ref_cavity_state(ref_cavity) = REF_CAVITY_PARTITION_CONSTRAINED;
        return REF_SUCCESS;
      }
      seg_nodes[2] = ref_cell_c2n(ref_cell, ref_cell_id_index(ref_cell), cell);
    }
    REIS(2, ref_list_n(ref_cavity_tri_list(ref_cavity)), "expect two tri");
    RUS(REF_EMPTY, seg_nodes[2], "faceid not set");
    seg_nodes[0] = node0;
    seg_nodes[1] = node3;
    RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    seg_nodes[0] = node3;
    seg_nodes[1] = node1;
    RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    seg_nodes[0] = node1;
    seg_nodes[1] = node2;
    RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
    seg_nodes[0] = node2;
    seg_nodes[1] = node0;
    RSS(ref_cavity_insert_seg(ref_cavity, seg_nodes), "tri side");
  }

  RSB(ref_cavity_verify_face_manifold(ref_cavity), "swap face manifold", {
    printf(" %f %f %f\n",
           ref_node_xyz(ref_node, 0, ref_cavity_node(ref_cavity)),
           ref_node_xyz(ref_node, 1, ref_cavity_node(ref_cavity)),
           ref_node_xyz(ref_node, 2, ref_cavity_node(ref_cavity)));
  });
  RSS(ref_cavity_verify_seg_manifold(ref_cavity), "swap seg manifold");

  return REF_SUCCESS;
}